

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUserDefinedUnit(string *name,precise_unit *un)

{
  undefined4 uVar1;
  bool bVar2;
  unit this;
  mapped_type *pmVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  precise_unit *in_stack_ffffffffffffffe8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  bVar2 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_ffffffffffffffe8,
                     (memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (bVar2) {
    this_00 = in_RDI;
    this = unit_cast(in_stack_ffffffffffffffe8);
    std::
    unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_RDI);
    puVar4 = in_RSI;
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::operator[](in_RSI,(key_type *)in_RDI);
    pmVar3->multiplier_ = (double)(in_RSI->_M_h)._M_buckets;
    uVar1 = *(undefined4 *)((long)&(in_RSI->_M_h)._M_bucket_count + 4);
    pmVar3->base_units_ = (unit_data)*(undefined4 *)&(in_RSI->_M_h)._M_bucket_count;
    pmVar3->commodity_ = uVar1;
    std::atomic<bool>::load((atomic<bool> *)this,(memory_order)((ulong)in_RSI >> 0x20));
    std::atomic<bool>::store
              ((atomic<bool> *)this_00,SUB81((ulong)puVar4 >> 0x38,0),(memory_order)puVar4);
  }
  return;
}

Assistant:

void addUserDefinedUnit(const std::string& name, const precise_unit& un)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        user_defined_unit_names[unit_cast(un)] = name;
        user_defined_units[name] = un;
        allowUserDefinedUnits.store(
            allowUserDefinedUnits.load(std::memory_order_acquire),
            std::memory_order_release);
    }
}